

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  Atom AVar1;
  wchar_t wVar2;
  int iVar3;
  unsigned_long uVar4;
  _GLFWwindow *window;
  double dVar5;
  int *piStack_128;
  int *piStack_120;
  int *piStack_118;
  int *piStack_110;
  double dStack_108;
  timeval tStack_100;
  undefined4 auStack_f0 [8];
  undefined8 uStack_d0;
  Atom AStack_c8;
  undefined4 uStack_c0;
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_128 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  piStack_110 = top;
  wVar2 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
  AVar1 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && wVar2 == L'\0') {
    piStack_120 = right;
    piStack_118 = bottom;
    memset(auStack_f0,0,0xc0);
    auStack_f0[0] = 0x21;
    uStack_d0 = *(undefined8 *)(handle + 0x270);
    uStack_c0 = 0x20;
    AStack_c8 = AVar1;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_f0);
    dStack_108 = _glfwPlatformGetTime();
    dStack_108 = dStack_108 + 0.5;
    while (iVar3 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle),
          right = piStack_120, bottom = piStack_118, iVar3 == 0) {
      dVar5 = _glfwPlatformGetTime();
      if (dStack_108 - dVar5 <= 0.0) {
        _glfwInputError(0x10008,
                        "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                       );
        return;
      }
      tStack_100.tv_sec = 0;
      tStack_100.tv_usec = (__suseconds_t)((dStack_108 - dVar5) * 1000000.0);
      selectDisplayConnection(&tStack_100);
    }
  }
  uVar4 = _glfwGetWindowProperty
                    (*(Window *)(handle + 0x270),_glfw.x11.NET_FRAME_EXTENTS,6,
                     (uchar **)&piStack_128);
  if (uVar4 == 4) {
    if (left != (int *)0x0) {
      *left = *piStack_128;
    }
    if (piStack_110 != (int *)0x0) {
      *piStack_110 = piStack_128[4];
    }
    if (right != (int *)0x0) {
      *right = piStack_128[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = piStack_128[6];
      goto LAB_001e1f3e;
    }
  }
  if (piStack_128 == (int *)0x0) {
    return;
  }
LAB_001e1f3e:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}